

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImathBoxAlgo.h
# Opt level: O2

bool Imath_3_2::findEntryAndExitPoints<float>
               (Line3<float> *r,Box<Imath_3_2::Vec3<float>_> *b,Vec3<float> *entry,Vec3<float> *exit
               )

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  undefined4 uVar12;
  undefined4 uVar13;
  undefined4 uVar14;
  undefined4 uVar15;
  undefined4 uVar16;
  undefined4 uVar17;
  undefined4 uVar18;
  undefined4 uVar19;
  undefined4 uVar20;
  undefined4 uVar21;
  undefined4 uVar22;
  undefined4 uVar23;
  undefined4 uVar24;
  undefined4 uVar25;
  undefined4 uVar26;
  undefined4 uVar27;
  undefined4 uVar28;
  undefined4 uVar29;
  undefined4 uVar30;
  undefined4 uVar31;
  undefined4 uVar32;
  undefined4 uVar33;
  undefined4 uVar34;
  undefined4 uVar35;
  undefined4 uVar36;
  undefined4 uVar37;
  undefined4 uVar38;
  undefined4 uVar39;
  undefined4 uVar40;
  undefined4 uVar41;
  undefined4 uVar42;
  undefined4 uVar43;
  undefined4 uVar44;
  undefined4 uVar45;
  undefined4 uVar46;
  undefined4 uVar47;
  undefined4 uVar48;
  Vec3<float> *pVVar49;
  bool bVar50;
  Box<Imath_3_2::Vec3<float>_> *pBVar51;
  uint uVar52;
  float fVar53;
  float fVar54;
  float fVar55;
  float fVar56;
  float fVar57;
  float fVar58;
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  float fVar65;
  ulong uVar66;
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  float fVar71;
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  float fVar74;
  
  bVar50 = Box<Imath_3_2::Vec3<float>_>::isEmpty(b);
  if (bVar50) {
    return false;
  }
  fVar53 = (r->dir).x;
  if (0.0 <= fVar53) {
    fVar56 = (b->min).x;
    fVar71 = (b->max).x;
    fVar54 = (r->pos).x;
    fVar55 = fVar71 - fVar54;
    fVar57 = fVar56 - fVar54;
    if (fVar53 <= 1.0) {
      fVar58 = fVar55;
      if (fVar55 <= -fVar55) {
        fVar58 = -fVar55;
      }
      if (fVar58 < fVar53 * 3.4028235e+38) {
        fVar58 = fVar57;
        if (fVar57 <= -fVar57) {
          fVar58 = -fVar57;
        }
        if (fVar58 < fVar53 * 3.4028235e+38) goto LAB_0011f05e;
      }
      if (fVar54 < fVar56) {
        return false;
      }
      if (fVar71 < fVar54) {
        return false;
      }
      goto LAB_0011f1bb;
    }
LAB_0011f05e:
    fVar55 = fVar55 / fVar53;
    fVar57 = fVar57 / fVar53;
    fVar53 = 3.4028235e+38;
    if (fVar55 < 3.4028235e+38) {
      exit->x = fVar71;
      uVar5 = (r->pos).y;
      uVar29 = (r->pos).z;
      uVar6 = (r->dir).y;
      uVar30 = (r->dir).z;
      auVar68._0_4_ = fVar55 * (float)uVar6 + (float)uVar5;
      auVar68._4_4_ = fVar55 * (float)uVar30 + (float)uVar29;
      auVar68._8_4_ = fVar55 * 0.0 + 0.0;
      auVar68._12_4_ = fVar55 * 0.0 + 0.0;
      uVar7 = (b->min).y;
      uVar31 = (b->min).z;
      uVar8 = (b->max).y;
      uVar32 = (b->max).z;
      auVar60._4_4_ = uVar32;
      auVar60._0_4_ = uVar8;
      auVar60._8_8_ = 0;
      auVar60 = minps(auVar60,auVar68);
      uVar66 = CONCAT44(~-(uint)(auVar68._4_4_ < (float)uVar31) & auVar60._4_4_,
                        ~-(uint)(auVar68._0_4_ < (float)uVar7) & auVar60._0_4_) |
               CONCAT44(uVar31 & -(uint)(auVar68._4_4_ < (float)uVar31),
                        uVar7 & -(uint)(auVar68._0_4_ < (float)uVar7));
      exit->y = (float)(int)uVar66;
      exit->z = (float)(int)(uVar66 >> 0x20);
      fVar53 = fVar55;
    }
    fVar56 = -3.4028235e+38;
    pBVar51 = b;
    if (-3.4028235e+38 < fVar57) goto LAB_0011f0cb;
  }
  else {
    fVar56 = (b->min).x;
    fVar71 = (b->max).x;
    fVar54 = (r->pos).x;
    fVar55 = fVar56 - fVar54;
    fVar57 = fVar71 - fVar54;
    if (-1.0 <= fVar53) {
      fVar58 = fVar55;
      if (fVar55 <= -fVar55) {
        fVar58 = -fVar55;
      }
      if (fVar58 < fVar53 * -3.4028235e+38) {
        fVar58 = fVar57;
        if (fVar57 <= -fVar57) {
          fVar58 = -fVar57;
        }
        if (fVar58 < fVar53 * -3.4028235e+38) goto LAB_0011efc0;
      }
      if (fVar54 < fVar56) {
        return false;
      }
      if (fVar71 < fVar54) {
        return false;
      }
LAB_0011f1bb:
      fVar56 = -3.4028235e+38;
      fVar53 = 3.4028235e+38;
    }
    else {
LAB_0011efc0:
      fVar55 = fVar55 / fVar53;
      fVar57 = fVar57 / fVar53;
      fVar53 = 3.4028235e+38;
      if (fVar55 < 3.4028235e+38) {
        exit->x = fVar56;
        uVar1 = (r->pos).y;
        uVar25 = (r->pos).z;
        uVar2 = (r->dir).y;
        uVar26 = (r->dir).z;
        auVar67._0_4_ = fVar55 * (float)uVar2 + (float)uVar1;
        auVar67._4_4_ = fVar55 * (float)uVar26 + (float)uVar25;
        auVar67._8_4_ = fVar55 * 0.0 + 0.0;
        auVar67._12_4_ = fVar55 * 0.0 + 0.0;
        uVar3 = (b->min).y;
        uVar27 = (b->min).z;
        uVar4 = (b->max).y;
        uVar28 = (b->max).z;
        auVar59._4_4_ = uVar28;
        auVar59._0_4_ = uVar4;
        auVar59._8_8_ = 0;
        auVar60 = minps(auVar59,auVar67);
        uVar66 = CONCAT44(~-(uint)(auVar67._4_4_ < (float)uVar27) & auVar60._4_4_,
                          ~-(uint)(auVar67._0_4_ < (float)uVar3) & auVar60._0_4_) |
                 CONCAT44(uVar27 & -(uint)(auVar67._4_4_ < (float)uVar27),
                          uVar3 & -(uint)(auVar67._0_4_ < (float)uVar3));
        exit->y = (float)(int)uVar66;
        exit->z = (float)(int)(uVar66 >> 0x20);
        fVar53 = fVar55;
      }
      fVar56 = -3.4028235e+38;
      if (-3.4028235e+38 < fVar57) {
        pBVar51 = (Box<Imath_3_2::Vec3<float>_> *)&b->max;
LAB_0011f0cb:
        entry->x = (pBVar51->min).x;
        uVar9 = (r->pos).y;
        uVar33 = (r->pos).z;
        uVar10 = (r->dir).y;
        uVar34 = (r->dir).z;
        auVar69._0_4_ = fVar57 * (float)uVar10 + (float)uVar9;
        auVar69._4_4_ = fVar57 * (float)uVar34 + (float)uVar33;
        auVar69._8_4_ = fVar57 * 0.0 + 0.0;
        auVar69._12_4_ = fVar57 * 0.0 + 0.0;
        uVar11 = (b->min).y;
        uVar35 = (b->min).z;
        uVar12 = (b->max).y;
        uVar36 = (b->max).z;
        auVar61._4_4_ = uVar36;
        auVar61._0_4_ = uVar12;
        auVar61._8_8_ = 0;
        auVar60 = minps(auVar61,auVar69);
        uVar66 = CONCAT44(~-(uint)(auVar69._4_4_ < (float)uVar35) & auVar60._4_4_,
                          ~-(uint)(auVar69._0_4_ < (float)uVar11) & auVar60._0_4_) |
                 CONCAT44(uVar35 & -(uint)(auVar69._4_4_ < (float)uVar35),
                          uVar11 & -(uint)(auVar69._0_4_ < (float)uVar11));
        entry->y = (float)(int)uVar66;
        entry->z = (float)(int)(uVar66 >> 0x20);
        fVar56 = fVar57;
      }
    }
  }
  fVar71 = (r->dir).y;
  if (0.0 <= fVar71) {
    fVar54 = (b->min).y;
    fVar55 = (b->max).y;
    fVar57 = (r->pos).y;
    fVar65 = fVar55 - fVar57;
    fVar58 = fVar54 - fVar57;
    if (fVar71 <= 1.0) {
      fVar74 = fVar65;
      if (fVar65 <= -fVar65) {
        fVar74 = -fVar65;
      }
      if (fVar74 < fVar71 * 3.4028235e+38) {
        fVar74 = fVar58;
        if (fVar58 <= -fVar58) {
          fVar74 = -fVar58;
        }
        if (fVar74 < fVar71 * 3.4028235e+38) goto LAB_0011f2d3;
      }
      if (fVar57 < fVar54) {
        return false;
      }
      if (fVar55 < fVar57) {
        return false;
      }
    }
    else {
LAB_0011f2d3:
      fVar65 = fVar65 / fVar71;
      fVar58 = fVar58 / fVar71;
      if (fVar65 < fVar53) {
        fVar54 = (r->dir).x * fVar65 + (r->pos).x;
        fVar53 = (b->min).x;
        fVar71 = (b->max).x;
        if (fVar54 <= fVar71) {
          fVar71 = fVar54;
        }
        uVar52 = -(uint)(fVar54 < fVar53);
        exit->x = (float)(uVar52 & (uint)fVar53 | ~uVar52 & (uint)fVar71);
        exit->y = fVar55;
        fVar54 = (r->dir).z * fVar65 + (r->pos).z;
        fVar53 = (b->min).z;
        fVar71 = (b->max).z;
        if (fVar54 <= fVar71) {
          fVar71 = fVar54;
        }
        uVar52 = -(uint)(fVar54 < fVar53);
        exit->z = (float)(uVar52 & (uint)fVar53 | ~uVar52 & (uint)fVar71);
        fVar53 = fVar65;
      }
      if (fVar56 < fVar58) {
        pVVar49 = &b->min;
        goto LAB_0011f364;
      }
    }
  }
  else {
    fVar54 = (b->min).y;
    fVar55 = (b->max).y;
    fVar57 = (r->pos).y;
    fVar65 = fVar54 - fVar57;
    fVar58 = fVar55 - fVar57;
    if (-1.0 <= fVar71) {
      fVar74 = fVar65;
      if (fVar65 <= -fVar65) {
        fVar74 = -fVar65;
      }
      if (fVar74 < fVar71 * -3.4028235e+38) {
        fVar74 = fVar58;
        if (fVar58 <= -fVar58) {
          fVar74 = -fVar58;
        }
        if (fVar74 < fVar71 * -3.4028235e+38) goto LAB_0011f210;
      }
      if (fVar57 < fVar54) {
        return false;
      }
      if (fVar55 < fVar57) {
        return false;
      }
    }
    else {
LAB_0011f210:
      fVar65 = fVar65 / fVar71;
      fVar58 = fVar58 / fVar71;
      if (fVar65 < fVar53) {
        fVar55 = (r->dir).x * fVar65 + (r->pos).x;
        fVar53 = (b->min).x;
        fVar71 = (b->max).x;
        if (fVar55 <= fVar71) {
          fVar71 = fVar55;
        }
        uVar52 = -(uint)(fVar55 < fVar53);
        exit->x = (float)(uVar52 & (uint)fVar53 | ~uVar52 & (uint)fVar71);
        exit->y = fVar54;
        fVar54 = (r->dir).z * fVar65 + (r->pos).z;
        fVar53 = (b->min).z;
        fVar71 = (b->max).z;
        if (fVar54 <= fVar71) {
          fVar71 = fVar54;
        }
        uVar52 = -(uint)(fVar54 < fVar53);
        exit->z = (float)(uVar52 & (uint)fVar53 | ~uVar52 & (uint)fVar71);
        fVar53 = fVar65;
      }
      if (fVar56 < fVar58) {
        pVVar49 = &b->max;
LAB_0011f364:
        fVar54 = (r->dir).x * fVar58 + (r->pos).x;
        fVar56 = (b->min).x;
        fVar71 = (b->max).x;
        if (fVar54 <= fVar71) {
          fVar71 = fVar54;
        }
        uVar52 = -(uint)(fVar54 < fVar56);
        entry->x = (float)(uVar52 & (uint)fVar56 | ~uVar52 & (uint)fVar71);
        entry->y = pVVar49->y;
        fVar54 = (r->dir).z * fVar58 + (r->pos).z;
        fVar56 = (b->min).z;
        fVar71 = (b->max).z;
        if (fVar54 <= fVar71) {
          fVar71 = fVar54;
        }
        uVar52 = -(uint)(fVar54 < fVar56);
        entry->z = (float)(uVar52 & (uint)fVar56 | ~uVar52 & (uint)fVar71);
        fVar56 = fVar58;
      }
    }
  }
  fVar71 = (r->dir).z;
  if (0.0 <= fVar71) {
    fVar54 = (b->min).z;
    fVar55 = (b->max).z;
    fVar57 = (r->pos).z;
    fVar65 = fVar55 - fVar57;
    fVar58 = fVar54 - fVar57;
    if (fVar71 <= 1.0) {
      fVar74 = fVar65;
      if (fVar65 <= -fVar65) {
        fVar74 = -fVar65;
      }
      if (fVar74 < fVar71 * 3.4028235e+38) {
        fVar74 = fVar58;
        if (fVar58 <= -fVar58) {
          fVar74 = -fVar58;
        }
        if (fVar74 < fVar71 * 3.4028235e+38) goto LAB_0011f56a;
      }
      if (fVar57 < fVar54) {
        return false;
      }
      if (fVar55 < fVar57) {
        return false;
      }
      goto LAB_0011f6b7;
    }
LAB_0011f56a:
    fVar65 = fVar65 / fVar71;
    fVar58 = fVar58 / fVar71;
    if (fVar65 < fVar53) {
      uVar17 = (r->pos).x;
      uVar41 = (r->pos).y;
      uVar18 = (r->dir).x;
      uVar42 = (r->dir).y;
      auVar73._0_4_ = fVar65 * (float)uVar18 + (float)uVar17;
      auVar73._4_4_ = fVar65 * (float)uVar42 + (float)uVar41;
      auVar73._8_4_ = fVar65 * 0.0 + 0.0;
      auVar73._12_4_ = fVar65 * 0.0 + 0.0;
      uVar19 = (b->min).x;
      uVar43 = (b->min).y;
      uVar20 = (b->max).x;
      uVar44 = (b->max).y;
      auVar63._4_4_ = uVar44;
      auVar63._0_4_ = uVar20;
      auVar63._8_8_ = 0;
      auVar60 = minps(auVar63,auVar73);
      uVar66 = CONCAT44(~-(uint)(auVar73._4_4_ < (float)uVar43) & auVar60._4_4_,
                        ~-(uint)(auVar73._0_4_ < (float)uVar19) & auVar60._0_4_) |
               CONCAT44(uVar43 & -(uint)(auVar73._4_4_ < (float)uVar43),
                        uVar19 & -(uint)(auVar73._0_4_ < (float)uVar19));
      exit->x = (float)(int)uVar66;
      exit->y = (float)(int)(uVar66 >> 0x20);
      exit->z = fVar55;
      fVar53 = fVar65;
    }
    if (fVar58 <= fVar56) goto LAB_0011f6b7;
    pVVar49 = &b->min;
  }
  else {
    fVar54 = (b->min).z;
    fVar55 = (b->max).z;
    fVar57 = (r->pos).z;
    fVar65 = fVar54 - fVar57;
    fVar58 = fVar55 - fVar57;
    if (-1.0 <= fVar71) {
      fVar74 = fVar65;
      if (fVar65 <= -fVar65) {
        fVar74 = -fVar65;
      }
      if (fVar74 < fVar71 * -3.4028235e+38) {
        fVar74 = fVar58;
        if (fVar58 <= -fVar58) {
          fVar74 = -fVar58;
        }
        if (fVar74 < fVar71 * -3.4028235e+38) goto LAB_0011f4dc;
      }
      if (fVar57 < fVar54) {
        return false;
      }
      if (fVar55 < fVar57) {
        return false;
      }
      goto LAB_0011f6b7;
    }
LAB_0011f4dc:
    fVar65 = fVar65 / fVar71;
    fVar58 = fVar58 / fVar71;
    if (fVar65 < fVar53) {
      uVar13 = (r->pos).x;
      uVar37 = (r->pos).y;
      uVar14 = (r->dir).x;
      uVar38 = (r->dir).y;
      auVar72._0_4_ = fVar65 * (float)uVar14 + (float)uVar13;
      auVar72._4_4_ = fVar65 * (float)uVar38 + (float)uVar37;
      auVar72._8_4_ = fVar65 * 0.0 + 0.0;
      auVar72._12_4_ = fVar65 * 0.0 + 0.0;
      uVar15 = (b->min).x;
      uVar39 = (b->min).y;
      uVar16 = (b->max).x;
      uVar40 = (b->max).y;
      auVar62._4_4_ = uVar40;
      auVar62._0_4_ = uVar16;
      auVar62._8_8_ = 0;
      auVar60 = minps(auVar62,auVar72);
      uVar66 = CONCAT44(~-(uint)(auVar72._4_4_ < (float)uVar39) & auVar60._4_4_,
                        ~-(uint)(auVar72._0_4_ < (float)uVar15) & auVar60._0_4_) |
               CONCAT44(uVar39 & -(uint)(auVar72._4_4_ < (float)uVar39),
                        uVar15 & -(uint)(auVar72._0_4_ < (float)uVar15));
      exit->x = (float)(int)uVar66;
      exit->y = (float)(int)(uVar66 >> 0x20);
      exit->z = fVar54;
      fVar53 = fVar65;
    }
    if (fVar58 <= fVar56) goto LAB_0011f6b7;
    pVVar49 = &b->max;
  }
  uVar21 = (r->pos).x;
  uVar45 = (r->pos).y;
  uVar22 = (r->dir).x;
  uVar46 = (r->dir).y;
  auVar70._0_4_ = fVar58 * (float)uVar22 + (float)uVar21;
  auVar70._4_4_ = fVar58 * (float)uVar46 + (float)uVar45;
  auVar70._8_4_ = fVar58 * 0.0 + 0.0;
  auVar70._12_4_ = fVar58 * 0.0 + 0.0;
  uVar23 = (b->min).x;
  uVar47 = (b->min).y;
  uVar24 = (b->max).x;
  uVar48 = (b->max).y;
  auVar64._4_4_ = uVar48;
  auVar64._0_4_ = uVar24;
  auVar64._8_8_ = 0;
  auVar60 = minps(auVar64,auVar70);
  uVar66 = CONCAT44(~-(uint)(auVar70._4_4_ < (float)uVar47) & auVar60._4_4_,
                    ~-(uint)(auVar70._0_4_ < (float)uVar23) & auVar60._0_4_) |
           CONCAT44(uVar47 & -(uint)(auVar70._4_4_ < (float)uVar47),
                    uVar23 & -(uint)(auVar70._0_4_ < (float)uVar23));
  entry->x = (float)(int)uVar66;
  entry->y = (float)(int)(uVar66 >> 0x20);
  entry->z = pVVar49->z;
  fVar56 = fVar58;
LAB_0011f6b7:
  return fVar56 <= fVar53;
}

Assistant:

IMATH_HOSTDEVICE IMATH_CONSTEXPR14 bool
findEntryAndExitPoints (
    const Line3<T>& r, const Box<Vec3<T>>& b, Vec3<T>& entry, Vec3<T>& exit)
    IMATH_NOEXCEPT
{
    if (b.isEmpty ())
    {
        //
        // No ray intersects an empty box
        //

        return false;
    }

    //
    // The following description assumes that the ray's origin is outside
    // the box, but the code below works even if the origin is inside the
    // box:
    //
    // Between one and three "frontfacing" sides of the box are oriented
    // towards the ray's origin, and between one and three "backfacing"
    // sides are oriented away from the ray's origin.
    // We intersect the ray with the planes that contain the sides of the
    // box, and compare the distances between the ray's origin and the
    // ray-plane intersections.  The ray intersects the box if the most
    // distant frontfacing intersection is nearer than the nearest
    // backfacing intersection.  If the ray does intersect the box, then
    // the most distant frontfacing ray-plane intersection is the entry
    // point and the nearest backfacing ray-plane intersection is the
    // exit point.
    //

    const T TMAX = std::numeric_limits<T>::max ();

    T tFrontMax = -TMAX;
    T tBackMin  = TMAX;

    //
    // Minimum and maximum X sides.
    //

    if (r.dir.x >= 0)
    {
        T d1 = b.max.x - r.pos.x;
        T d2 = b.min.x - r.pos.x;

        if (r.dir.x > 1 ||
            (abs (d1) < TMAX * r.dir.x && abs (d2) < TMAX * r.dir.x))
        {
            T t1 = d1 / r.dir.x;
            T t2 = d2 / r.dir.x;

            if (tBackMin > t1)
            {
                tBackMin = t1;

                exit.x = b.max.x;
                exit.y = clamp (r.pos.y + t1 * r.dir.y, b.min.y, b.max.y);
                exit.z = clamp (r.pos.z + t1 * r.dir.z, b.min.z, b.max.z);
            }

            if (tFrontMax < t2)
            {
                tFrontMax = t2;

                entry.x = b.min.x;
                entry.y = clamp (r.pos.y + t2 * r.dir.y, b.min.y, b.max.y);
                entry.z = clamp (r.pos.z + t2 * r.dir.z, b.min.z, b.max.z);
            }
        }
        else if (r.pos.x < b.min.x || r.pos.x > b.max.x)
        {
            return false;
        }
    }
    else // r.dir.x < 0
    {
        T d1 = b.min.x - r.pos.x;
        T d2 = b.max.x - r.pos.x;

        if (r.dir.x < -1 ||
            (abs (d1) < -TMAX * r.dir.x && abs (d2) < -TMAX * r.dir.x))
        {
            T t1 = d1 / r.dir.x;
            T t2 = d2 / r.dir.x;

            if (tBackMin > t1)
            {
                tBackMin = t1;

                exit.x = b.min.x;
                exit.y = clamp (r.pos.y + t1 * r.dir.y, b.min.y, b.max.y);
                exit.z = clamp (r.pos.z + t1 * r.dir.z, b.min.z, b.max.z);
            }

            if (tFrontMax < t2)
            {
                tFrontMax = t2;

                entry.x = b.max.x;
                entry.y = clamp (r.pos.y + t2 * r.dir.y, b.min.y, b.max.y);
                entry.z = clamp (r.pos.z + t2 * r.dir.z, b.min.z, b.max.z);
            }
        }
        else if (r.pos.x < b.min.x || r.pos.x > b.max.x)
        {
            return false;
        }
    }

    //
    // Minimum and maximum Y sides.
    //

    if (r.dir.y >= 0)
    {
        T d1 = b.max.y - r.pos.y;
        T d2 = b.min.y - r.pos.y;

        if (r.dir.y > 1 ||
            (abs (d1) < TMAX * r.dir.y && abs (d2) < TMAX * r.dir.y))
        {
            T t1 = d1 / r.dir.y;
            T t2 = d2 / r.dir.y;

            if (tBackMin > t1)
            {
                tBackMin = t1;

                exit.x = clamp (r.pos.x + t1 * r.dir.x, b.min.x, b.max.x);
                exit.y = b.max.y;
                exit.z = clamp (r.pos.z + t1 * r.dir.z, b.min.z, b.max.z);
            }

            if (tFrontMax < t2)
            {
                tFrontMax = t2;

                entry.x = clamp (r.pos.x + t2 * r.dir.x, b.min.x, b.max.x);
                entry.y = b.min.y;
                entry.z = clamp (r.pos.z + t2 * r.dir.z, b.min.z, b.max.z);
            }
        }
        else if (r.pos.y < b.min.y || r.pos.y > b.max.y)
        {
            return false;
        }
    }
    else // r.dir.y < 0
    {
        T d1 = b.min.y - r.pos.y;
        T d2 = b.max.y - r.pos.y;

        if (r.dir.y < -1 ||
            (abs (d1) < -TMAX * r.dir.y && abs (d2) < -TMAX * r.dir.y))
        {
            T t1 = d1 / r.dir.y;
            T t2 = d2 / r.dir.y;

            if (tBackMin > t1)
            {
                tBackMin = t1;

                exit.x = clamp (r.pos.x + t1 * r.dir.x, b.min.x, b.max.x);
                exit.y = b.min.y;
                exit.z = clamp (r.pos.z + t1 * r.dir.z, b.min.z, b.max.z);
            }

            if (tFrontMax < t2)
            {
                tFrontMax = t2;

                entry.x = clamp (r.pos.x + t2 * r.dir.x, b.min.x, b.max.x);
                entry.y = b.max.y;
                entry.z = clamp (r.pos.z + t2 * r.dir.z, b.min.z, b.max.z);
            }
        }
        else if (r.pos.y < b.min.y || r.pos.y > b.max.y)
        {
            return false;
        }
    }

    //
    // Minimum and maximum Z sides.
    //

    if (r.dir.z >= 0)
    {
        T d1 = b.max.z - r.pos.z;
        T d2 = b.min.z - r.pos.z;

        if (r.dir.z > 1 ||
            (abs (d1) < TMAX * r.dir.z && abs (d2) < TMAX * r.dir.z))
        {
            T t1 = d1 / r.dir.z;
            T t2 = d2 / r.dir.z;

            if (tBackMin > t1)
            {
                tBackMin = t1;

                exit.x = clamp (r.pos.x + t1 * r.dir.x, b.min.x, b.max.x);
                exit.y = clamp (r.pos.y + t1 * r.dir.y, b.min.y, b.max.y);
                exit.z = b.max.z;
            }

            if (tFrontMax < t2)
            {
                tFrontMax = t2;

                entry.x = clamp (r.pos.x + t2 * r.dir.x, b.min.x, b.max.x);
                entry.y = clamp (r.pos.y + t2 * r.dir.y, b.min.y, b.max.y);
                entry.z = b.min.z;
            }
        }
        else if (r.pos.z < b.min.z || r.pos.z > b.max.z)
        {
            return false;
        }
    }
    else // r.dir.z < 0
    {
        T d1 = b.min.z - r.pos.z;
        T d2 = b.max.z - r.pos.z;

        if (r.dir.z < -1 ||
            (abs (d1) < -TMAX * r.dir.z && abs (d2) < -TMAX * r.dir.z))
        {
            T t1 = d1 / r.dir.z;
            T t2 = d2 / r.dir.z;

            if (tBackMin > t1)
            {
                tBackMin = t1;

                exit.x = clamp (r.pos.x + t1 * r.dir.x, b.min.x, b.max.x);
                exit.y = clamp (r.pos.y + t1 * r.dir.y, b.min.y, b.max.y);
                exit.z = b.min.z;
            }

            if (tFrontMax < t2)
            {
                tFrontMax = t2;

                entry.x = clamp (r.pos.x + t2 * r.dir.x, b.min.x, b.max.x);
                entry.y = clamp (r.pos.y + t2 * r.dir.y, b.min.y, b.max.y);
                entry.z = b.max.z;
            }
        }
        else if (r.pos.z < b.min.z || r.pos.z > b.max.z)
        {
            return false;
        }
    }

    return tFrontMax <= tBackMin;
}